

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_constants_carry_cap(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"pack-size");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x70) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"quiver-size");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x72) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"quiver-slot-size");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x74) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"thrown-quiver-mult");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x76) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"floor-size");
            if (iVar2 != 0) {
              return PARSE_ERROR_UNDEFINED_DIRECTIVE;
            }
            *(undefined2 *)((long)pvVar4 + 0x78) = uVar5;
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_carry_cap(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "pack-size"))
		z->pack_size = value;
	else if (streq(label, "quiver-size"))
		z->quiver_size = value;
	else if (streq(label, "quiver-slot-size"))
		z->quiver_slot_size = value;
	else if (streq(label, "thrown-quiver-mult"))
		z->thrown_quiver_mult = value;
	else if (streq(label, "floor-size"))
		z->floor_size = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}